

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImGuiListClipperRange * __thiscall
ImVector<ImGuiListClipperRange>::insert
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *it,ImGuiListClipperRange *v)

{
  int *piVar1;
  int iVar2;
  ImGuiListClipperRange *pIVar3;
  ImGuiListClipperRange *pIVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  lVar7 = (long)it - (long)this->Data;
  iVar2 = this->Capacity;
  if (this->Size == iVar2) {
    iVar8 = this->Size + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar6) {
      iVar8 = iVar6;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar4 = (ImGuiListClipperRange *)
               (*GImAllocatorAllocFunc)((long)iVar8 * 0xc,GImAllocatorUserData);
      if (this->Data != (ImGuiListClipperRange *)0x0) {
        memcpy(pIVar4,this->Data,(long)this->Size * 0xc);
        pIVar3 = this->Data;
        if ((pIVar3 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      this->Data = pIVar4;
      this->Capacity = iVar8;
    }
  }
  lVar5 = (long)this->Size + (lVar7 >> 2) * 0x5555555555555555;
  if (lVar5 != 0 && (lVar7 >> 2) * -0x5555555555555555 <= (long)this->Size) {
    memmove((void *)((long)this->Data + lVar7 + 0xc),(void *)((long)this->Data + lVar7),lVar5 * 0xc)
    ;
  }
  pIVar4 = this->Data;
  *(undefined4 *)((long)pIVar4 + lVar7 + 8) = *(undefined4 *)&v->PosToIndexConvert;
  *(undefined8 *)((long)pIVar4 + lVar7) = *(undefined8 *)v;
  this->Size = this->Size + 1;
  return (ImGuiListClipperRange *)(lVar7 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }